

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O2

void helper_dadd(CPUPPCState_conflict *env,ppc_fprp_t *t,ppc_fprp_t *a,ppc_fprp_t *b)

{
  PPC_DFP dfp;
  undefined1 auStack_e8 [100];
  decNumber_conflict local_84 [3];
  decNumber_conflict local_60 [3];
  decContext local_3c;
  
  dfp_prepare_decimal64((PPC_DFP *)auStack_e8,a,b,env);
  decNumberAdd((decNumber_conflict *)(auStack_e8 + 0x40),local_84,local_60,&local_3c);
  dfp_finalize_decimal64((PPC_DFP *)auStack_e8);
  ADD_PPs((PPC_DFP *)auStack_e8);
  t->u64[1] = auStack_e8._16_8_;
  return;
}

Assistant:

static void SUB_PPs(struct PPC_DFP *dfp)
{
    dfp_set_FPRF_from_FRT(dfp);
    dfp_check_for_OX(dfp);
    dfp_check_for_UX(dfp);
    dfp_check_for_XX(dfp);
    dfp_check_for_VXSNAN(dfp);
    dfp_check_for_VXISI_subtract(dfp);
}